

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintdevice.cpp
# Opt level: O3

double __thiscall
QPaintDevice::getDecodedMetricF
          (QPaintDevice *this,PaintDeviceMetric metricA,PaintDeviceMetric metricB)

{
  int iVar1;
  long in_FS_OFFSET;
  qint32 buf [2];
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  iVar1 = (*this->_vptr_QPaintDevice[4])();
  *(int *)((long)&local_28 + (ulong)(metricA & PdmWidth) * 4) = iVar1;
  iVar1 = (*this->_vptr_QPaintDevice[4])(this,(ulong)metricB);
  *(int *)((long)&local_28 + (ulong)(metricB & PdmWidth) * 4) = iVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (double)local_28;
  }
  __stack_chk_fail();
}

Assistant:

double QPaintDevice::getDecodedMetricF(PaintDeviceMetric metricA, PaintDeviceMetric metricB) const
{
    qint32 buf[2];
    // The Encoded metric enum values come in pairs of one odd and one even value.
    // We map those to the 0 and 1 indexes of buf by taking just the least significant bit.
    // Same mapping here as in the encodeMetricF() function, to ensure correct order.
    buf[metricA & 1] = metric(metricA);
    buf[metricB & 1] = metric(metricB);
    double res;
    memcpy(&res, buf, sizeof(res));
    return res;
}